

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

float testThreadSafeAllocator(void)

{
  float fVar1;
  ostream *poVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> local_348;
  duration<float,_std::ratio<1L,_1L>_> local_340;
  float local_33c;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_338;
  float duration;
  time_point end;
  string *v3;
  int *local_320;
  int *v2;
  double local_308;
  double *local_300;
  double *v1;
  size_t i;
  time_point begin;
  ThreadSafeStack<44UL> stack;
  
  AO::Allocator::Version_1::ThreadSafeStack<44UL>::ThreadSafeStack((ThreadSafeStack<44UL> *)&begin);
  i = std::chrono::_V2::system_clock::now();
  for (v1 = (double *)0x0; v1 < (double *)0x989680; v1 = (double *)((long)v1 + 1)) {
    local_308 = 1.0;
    local_300 = AO::Allocator::Version_1::Stack<44ul>::create<double,double>
                          ((Stack<44ul> *)&begin,&local_308);
    v3._4_4_ = 2;
    local_320 = AO::Allocator::Version_1::Stack<44ul>::create<int,int>
                          ((Stack<44ul> *)&begin,(int *)((long)&v3 + 4));
    end.__d.__r = (duration)
                  AO::Allocator::Version_1::Stack<44ul>::
                  create<std::__cxx11::string,char_const(&)[2]>
                            ((Stack<44ul> *)&begin,(char (*) [2])"3");
    AO::Allocator::Version_1::Stack<44ul>::destroy<std::__cxx11::string>
              ((Stack<44ul> *)&begin,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)end.__d.__r);
    AO::Allocator::Version_1::Stack<44UL>::destroy<int>((Stack<44UL> *)&begin,local_320);
    AO::Allocator::Version_1::Stack<44UL>::destroy<double>((Stack<44UL> *)&begin,local_300);
  }
  tStack_338.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_348.__r =
       (rep_conflict)
       std::chrono::operator-
                 (&stack0xfffffffffffffcc8,
                  (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)&i);
  local_340.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<float,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                      (&local_348);
  local_33c = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count(&local_340);
  poVar2 = std::operator<<((ostream *)&std::cout,"Thread-Safe Allocator: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_33c);
  poVar2 = std::operator<<(poVar2,"s");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  fVar1 = local_33c;
  AO::Allocator::Version_1::ThreadSafeStack<44UL>::~ThreadSafeStack((ThreadSafeStack<44UL> *)&begin)
  ;
  return fVar1;
}

Assistant:

static float testThreadSafeAllocator(void)
{
	AO::Allocator::ThreadSafeStack<sizeof(double) + sizeof(int) + sizeof(std::string)> stack;
	auto const begin = std::chrono::high_resolution_clock::now();
	for (std::size_t i = 0; i < size; ++i)
	{
		double const *v1 = stack.create<double>(1.0);
		int const *v2 = stack.create<int>(2);
		std::string const *v3 = stack.create<std::string>("3");
		stack.destroy(v3);
		stack.destroy(v2);
		stack.destroy(v1);
	}
	auto const end = std::chrono::high_resolution_clock::now();
	float const duration = std::chrono::duration_cast<std::chrono::duration<float, std::chrono::seconds::period>>(end - begin).count();
	std::cout << "Thread-Safe Allocator: " << duration << "s" << std::endl;
	return duration;
}